

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O0

void MemoryProfiler::PrintCurrentThread(void)

{
  MemoryProfiler *this;
  undefined8 *in_FS_OFFSET;
  MemoryProfiler *instance;
  
  this = *(MemoryProfiler **)*in_FS_OFFSET;
  Output::Print(
               L"========================================================================================================\n"
               );
  Output::Print(L"Memory Profile (Current thread)\n");
  if (this != (MemoryProfiler *)0x0) {
    Print(this);
  }
  Output::Flush();
  return;
}

Assistant:

void
MemoryProfiler::PrintCurrentThread()
{
    MemoryProfiler* instance = NULL;
    instance = MemoryProfiler::Instance;

    Output::Print(_u("========================================================================================================\n"));
    Output::Print(_u("Memory Profile (Current thread)\n"));
    if (instance != nullptr)
    {
        instance->Print();
    }

    Output::Flush();
}